

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  ulong uVar2;
  uint size;
  Type TVar3;
  int iVar4;
  uint uVar5;
  EntryType *dst;
  int *piVar6;
  long lVar7;
  long lVar8;
  ulong local_58;
  uint local_4c;
  Type local_48;
  int *newBuckets;
  Type local_34;
  
  uVar1 = this->count;
  size = uVar1 * 2;
  local_34 = 4;
  if ((8 < size) && (local_34 = uVar1 & 0x7fffffff, (uVar1 - 1 & local_34) != 0)) {
    iVar4 = 0x1f;
    if (local_34 != 0) {
      for (; local_34 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_34 = 1 << (-((byte)iVar4 ^ 0x1f) & 0x1f);
  }
  local_48.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (local_34 == this->bucketCount) {
    dst = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>>,Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::Recycler>
              (dst,(long)(int)size,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = size;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_48.ptr,(EntryType **)&newBuckets,local_34,size);
    local_4c = size;
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>>,Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::Recycler>
              ((SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                *)newBuckets,(long)(int)size,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar4 = this->count;
    if (0 < iVar4) {
      lVar7 = 8;
      lVar8 = 0;
      piVar6 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar6 + lVar7)) {
          uVar2 = *(ulong *)((long)piVar6 + lVar7 + -8);
          Memory::Recycler::WBSetBit((char *)&local_58);
          local_58 = uVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
          uVar5 = GetBucket((uint)(local_58 >> 3) | 1,local_34,this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar7) = local_48.ptr[(int)uVar5];
          local_48.ptr[(int)uVar5] = (int)lVar8;
          iVar4 = this->count;
          piVar6 = newBuckets;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar8 < iVar4);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar1 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    TVar3.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar6 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
          *)piVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = local_34;
    this->size = uVar1;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }